

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::collapse_selected_element(Mesh *this)

{
  HalfedgeElement *this_00;
  Edge *this_01;
  HalfedgeIter *pHVar1;
  pointer pHVar2;
  EdgeIter *pEVar3;
  FaceIter *pFVar4;
  Vertex *pVVar5;
  VertexIter local_30;
  VertexIter v;
  Face *face;
  Edge *edge;
  HalfedgeElement *element;
  Mesh *this_local;
  
  if (((this->super_SceneObject).scene != (Scene *)0x0) &&
     (this_00 = (((this->super_SceneObject).scene)->selected).element,
     this_00 != (HalfedgeElement *)0x0)) {
    this_01 = HalfedgeElement::getEdge(this_00);
    v._M_node = (_List_node_base *)HalfedgeElement::getFace(this_00);
    std::_List_iterator<CMU462::Vertex>::_List_iterator(&local_30);
    if (this_01 == (Edge *)0x0) {
      if (v._M_node == (_List_node_base *)0x0) {
        return;
      }
      pHVar1 = Face::halfedge((Face *)v._M_node);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar1);
      pFVar4 = Halfedge::face(pHVar2);
      local_30 = HalfedgeMesh::collapseFace(&this->mesh,pFVar4->_M_node);
    }
    else {
      pHVar1 = Edge::halfedge(this_01);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar1);
      pEVar3 = Halfedge::edge(pHVar2);
      local_30 = HalfedgeMesh::collapseEdge(&this->mesh,pEVar3->_M_node);
    }
    pVVar5 = elementAddress(local_30);
    (((this->super_SceneObject).scene)->selected).element = &pVVar5->super_HalfedgeElement;
    Selection::clear(&((this->super_SceneObject).scene)->hovered);
    Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
  }
  return;
}

Assistant:

void Mesh::collapse_selected_element() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   Face *face = element->getFace();
   VertexIter v;

   if (edge != nullptr)
   {
      v = mesh.collapseEdge(edge->halfedge()->edge());
   }
   else if( face != nullptr )
   {
      v = mesh.collapseFace(face->halfedge()->face());
   }
   else
   {
      return;
   }

   scene->selected.element = elementAddress( v );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}